

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

double __thiscall tetgenmesh::tetaspectratio(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  tetgenmesh *this_00;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double rhs [4];
  int indx [4];
  double D;
  double H [4];
  double A [4] [4];
  double N [4] [3];
  double edgelength [6];
  double V [6] [3];
  double local_238 [4];
  int local_218;
  int local_214;
  int local_210;
  double local_200;
  double local_1f8 [4];
  double local_1d8 [4];
  double adStack_1b8 [4];
  double adStack_198 [8];
  double local_158 [3];
  double local_140 [6];
  double adStack_110 [3];
  double local_f8 [9];
  double local_b0 [3];
  double adStack_98 [3];
  double adStack_80 [3];
  double adStack_68 [3];
  double adStack_50 [4];
  
  lVar2 = 0;
  do {
    local_140[lVar2 + 0xf] = pa[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_140[lVar2 + 0x12] = pb[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_140[lVar2 + 0x15] = pc[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_140[lVar2 + 0x18] = pb[lVar2] - pa[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_140[lVar2 + 0x1b] = pc[lVar2] - pb[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_140[lVar2 + 0x1e] = pa[lVar2] - pc[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pdVar3 = local_140 + 0x14;
  this_00 = (tetgenmesh *)0x0;
  do {
    dVar5 = pdVar3[-2];
    dVar4 = pdVar3[-1];
    dVar1 = *pdVar3;
    local_140[(long)((long)&this_00->addin + 1)] =
         pdVar3[-3] * pdVar3[-3] + pdVar3[-5] * pdVar3[-5] + pdVar3[-4] * pdVar3[-4];
    local_140[(long)((long)&this_00->addin + 2)] = dVar1 * dVar1 + dVar5 * dVar5 + dVar4 * dVar4;
    this_00 = (tetgenmesh *)((long)&this_00->in + 2);
    pdVar3 = pdVar3 + 6;
  } while (this_00 != (tetgenmesh *)0x6);
  lVar2 = 1;
  do {
    dVar5 = local_140[lVar2 + 9];
    if (local_140[lVar2 + 9] <= local_f8[0]) {
      dVar5 = local_f8[0];
    }
    lVar2 = lVar2 + 1;
    local_f8[0] = dVar5;
  } while (lVar2 != 6);
  lVar2 = 0;
  do {
    local_1d8[lVar2] = pa[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_1d8[lVar2 + 4] = pb[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    adStack_198[lVar2] = pc[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lu_decmp((tetgenmesh *)0x6,&local_1d8,3,&local_218,&local_200,0);
  dVar4 = (local_1d8[(long)local_218 * 4] * local_1d8[(long)local_214 * 4 + 1] *
          local_1d8[(long)local_210 * 4 + 2]) / 6.0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pdVar3 = local_158;
    lVar2 = 0;
    do {
      local_238[0] = 0.0;
      local_238[1] = 0.0;
      local_238[2] = 0.0;
      local_238[lVar2] = 1.0;
      lu_solve(this_00,&local_1d8,3,&local_218,local_238,0);
      pdVar3[2] = local_238[2];
      *pdVar3 = local_238[0];
      pdVar3[1] = local_238[1];
      lVar2 = lVar2 + 1;
      pdVar3 = pdVar3 + 3;
    } while (lVar2 != 3);
    lVar2 = -3;
    do {
      local_140[lVar2 + 9] = (-local_140[lVar2] - local_140[lVar2 + 3]) - local_140[lVar2 + 6];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    pdVar3 = local_140 + 2;
    lVar2 = 0;
    do {
      auVar6._0_8_ = pdVar3[-5] * pdVar3[-5] + pdVar3[-4] * pdVar3[-4];
      auVar6._8_8_ = pdVar3[-2] * pdVar3[-2] + pdVar3[-1] * pdVar3[-1];
      auVar7._8_8_ = *pdVar3 * *pdVar3 + auVar6._8_8_;
      auVar7._0_8_ = pdVar3[-3] * pdVar3[-3] + auVar6._0_8_;
      auVar7 = sqrtpd(auVar6,auVar7);
      *(undefined1 (*) [16])(local_1f8 + lVar2) = auVar7;
      lVar2 = lVar2 + 2;
      pdVar3 = pdVar3 + 6;
    } while (lVar2 != 4);
    lVar2 = 1;
    do {
      dVar4 = local_1f8[lVar2];
      if (local_1f8[lVar2] <= local_1f8[0]) {
        dVar4 = local_1f8[0];
      }
      lVar2 = lVar2 + 1;
      local_1f8[0] = dVar4;
    } while (lVar2 != 4);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar4 = dVar4 * dVar5;
  }
  else {
    dVar4 = 1e+200;
  }
  return dVar4;
}

Assistant:

REAL tetgenmesh::tetaspectratio(point pa, point pb, point pc, point pd)
{
  REAL V[6][3], edgelength[6], longlen;
  REAL vda[3], vdb[3], vdc[3];
  REAL N[4][3], A[4][4], rhs[4], D;
  REAL H[4], volume, minheightinv;
  int indx[4];
  int i, j; 

  // Set the edge vectors: V[0], ..., V[5]
  for (i = 0; i < 3; i++) V[0][i] = pa[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[1][i] = pb[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[2][i] = pc[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[3][i] = pb[i] - pa[i]; 
  for (i = 0; i < 3; i++) V[4][i] = pc[i] - pb[i]; 
  for (i = 0; i < 3; i++) V[5][i] = pa[i] - pc[i]; 

  // Get the squares of the edge lengths.
  for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

  // Calculate the longest and shortest edge length.
  longlen = edgelength[0];
  for (i = 1; i < 6; i++) {
    longlen  = edgelength[i] > longlen ? edgelength[i] : longlen;
  }

  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];
  // Lu-decompose the matrix A.
  lu_decmp(A, 3, indx, &D, 0);
  // Get the volume of abcd.
  volume = (A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
  // Check if it is zero.
  if (volume == 0.0) return 1.0e+200; // A degenerate tet.

  // Compute the 4 face normals (N[0], ..., N[3]).
  for (j = 0; j < 3; j++) {
    for (i = 0; i < 3; i++) rhs[i] = 0.0;
    rhs[j] = 1.0;  // Positive means the inside direction
    lu_solve(A, 3, indx, rhs, 0);
    for (i = 0; i < 3; i++) N[j][i] = rhs[i];
  }
  // Get the fourth normal by summing up the first three.
  for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
  // Normalized the normals.
  for (i = 0; i < 4; i++) {
    // H[i] is the inverse of the height of its corresponding face.
    H[i] = sqrt(dot(N[i], N[i]));
    // if (H[i] > 0.0) {
    //   for (j = 0; j < 3; j++) N[i][j] /= H[i];
    // }
  }
  // Get the radius of the inscribed sphere.
  // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
  // Get the biggest H[i] (corresponding to the smallest height).
  minheightinv = H[0];
  for (i = 1; i < 4; i++) {
    if (H[i] > minheightinv) minheightinv = H[i];
  }

  return sqrt(longlen) * minheightinv;
}